

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::start_session(session_impl *this)

{
  peer_class_pool *this_00;
  array<unsigned_int,_6UL> *paVar1;
  uint *puVar2;
  session_settings *this_01;
  io_context *piVar3;
  uint value;
  peer_class_t pVar4;
  uint uVar5;
  uint uVar6;
  peer_class *ppVar7;
  long *plVar8;
  uint uVar9;
  undefined8 uVar10;
  ptr local_c0;
  error_code ec;
  allocator<void> local_88 [4];
  uint local_84;
  string local_80;
  string local_60;
  string local_40;
  
  session_log(this,"start session");
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::ssl::context::set_default_verify_paths(&this->m_ssl_ctx,&ec);
  if (ec.failed_ == true) {
    (*(ec.cat_)->_vptr_error_category[4])(&local_c0,ec.cat_,(ulong)(uint)ec.val_);
    session_log(this,"SSL set_default verify_paths failed: %s",local_c0.a);
    ::std::__cxx11::string::~string((string *)&local_c0);
  }
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::asio::ssl::context::set_verify_mode(&this->m_peer_ssl_ctx,0,&ec);
  aux::ssl::set_server_name_callback
            ((this->m_peer_ssl_ctx).handle_,anon_unknown_119::ssl_server_name_callback,this,&ec);
  this->m_next_lsd_torrent = 0;
  this->m_next_dht_torrent = 0;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"global",(allocator<char> *)&local_c0);
  this_00 = &this->m_classes;
  pVar4 = peer_class_pool::new_peer_class(this_00,&local_40);
  (this->m_global_class).m_val = pVar4.m_val;
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"tcp",(allocator<char> *)&local_c0);
  pVar4 = peer_class_pool::new_peer_class(this_00,&local_60);
  (this->m_tcp_peer_class).m_val = pVar4.m_val;
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"local",(allocator<char> *)&local_c0);
  pVar4 = peer_class_pool::new_peer_class(this_00,&local_80);
  (this->m_local_peer_class).m_val = pVar4.m_val;
  ::std::__cxx11::string::~string((string *)&local_80);
  ppVar7 = peer_class_pool::at(this_00,(peer_class_t)(this->m_local_peer_class).m_val);
  ppVar7->ignore_unchoke_slots = true;
  ppVar7 = peer_class_pool::at(this_00,(peer_class_t)(this->m_local_peer_class).m_val);
  ppVar7->connection_limit_factor = 0x96;
  init_peer_class_filter(this,true);
  uVar9 = (this->m_tcp_peer_class).m_val;
  if (uVar9 < 0x20) {
    uVar9 = 1 << ((byte)uVar9 & 0x1f);
    paVar1 = &(this->m_peer_class_type_filter).m_peer_class_type;
    paVar1->_M_elems[0] = paVar1->_M_elems[0] | uVar9;
    puVar2 = (this->m_peer_class_type_filter).m_peer_class_type._M_elems + 2;
    *puVar2 = *puVar2 | uVar9;
    puVar2 = (this->m_peer_class_type_filter).m_peer_class_type._M_elems + 4;
    *puVar2 = *puVar2 | uVar9;
  }
  session_log(this,"version: %s revision: %lx","2.1.0.0",0x283cea598);
  uVar5 = max_open_files();
  this_01 = &this->m_settings;
  uVar6 = session_settings::get_int(this_01,0x4055);
  uVar9 = uVar5 * 8 - 0xa0;
  value = 5;
  if (0x3b < (int)uVar9) {
    value = uVar9 / 10;
  }
  if ((int)uVar6 <= (int)value) {
    value = uVar6;
  }
  session_settings::set_int(this_01,0x4055,value);
  if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
    uVar9 = session_settings::get_int(this_01,0x4055);
    session_log(this,"max-connections: %d max-files: %d",(ulong)uVar9,(ulong)uVar5);
  }
  piVar3 = this->m_io_context;
  local_c0.a = local_88;
  local_84 = 1;
  plVar8 = (long *)__tls_get_addr(&PTR_004d3f18);
  if (*plVar8 == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = *(undefined8 *)(*plVar8 + 8);
  }
  local_c0.v = boost::asio::detail::thread_info_base::
               allocate<boost::asio::detail::thread_info_base::default_tag>(uVar10,0x28);
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_c0.v)->super_scheduler_operation).next_ = (scheduler_operation *)0x0;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_c0.v)->super_scheduler_operation).func_ =
       boost::asio::detail::
       executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
       ::do_complete;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_c0.v)->super_scheduler_operation).task_result_ = 0;
  (((executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
     *)local_c0.v)->handler_).this = this;
  local_c0.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)local_c0.v;
  boost::asio::detail::scheduler::post_immediate_completion
            (piVar3->impl_,(operation *)local_c0.v,SUB41((local_84 & 2) >> 1,0));
  local_c0.v = (void *)0x0;
  local_c0.p = (executor_op<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_gubatron[P]libtorrent_src_session_impl_cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
                *)0x0;
  boost::asio::detail::
  executor_op<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gubatron[P]libtorrent/src/session_impl.cpp:676:22),_std::allocator<void>,_boost::asio::detail::scheduler_operation>
  ::ptr::reset(&local_c0);
  return;
}

Assistant:

void session_impl::start_session()
	{
#ifndef TORRENT_DISABLE_LOGGING
		session_log("start session");
#endif

#if TORRENT_USE_SSL
		error_code ec;
		m_ssl_ctx.set_default_verify_paths(ec);
#ifndef TORRENT_DISABLE_LOGGING
		if (ec) session_log("SSL set_default verify_paths failed: %s", ec.message().c_str());
		ec.clear();
#endif
#if defined TORRENT_WINDOWS && defined TORRENT_USE_OPENSSL && !defined TORRENT_WINRT
		// TODO: come up with some abstraction to do this for gnutls as well
		// load certificates from the windows system certificate store
		X509_STORE* store = X509_STORE_new();
		if (store)
		{
			HCERTSTORE system_store = CertOpenSystemStoreA(0, "ROOT");
			// this is best effort
			if (system_store)
			{
				CERT_CONTEXT const* ctx = nullptr;
				while ((ctx = CertEnumCertificatesInStore(system_store, ctx)) != nullptr)
				{
					unsigned char const* cert_ptr = reinterpret_cast<unsigned char const*>(ctx->pbCertEncoded);
					X509* x509 = d2i_X509(nullptr, &cert_ptr, ctx->cbCertEncoded);
					// this is best effort
					if (!x509) continue;
					X509_STORE_add_cert(store, x509);
					X509_free(x509);
				}
				CertFreeCertificateContext(ctx);
				CertCloseStore(system_store, 0);
			}
		}

		SSL_CTX* ssl_ctx = m_ssl_ctx.native_handle();
		SSL_CTX_set_cert_store(ssl_ctx, store);
#endif
#ifdef __APPLE__
		m_ssl_ctx.load_verify_file("/etc/ssl/cert.pem", ec);
#ifndef TORRENT_DISABLE_LOGGING
		if (ec) session_log("SSL load_verify_file failed: %s", ec.message().c_str());
		ec.clear();
#endif
		m_ssl_ctx.add_verify_path("/etc/ssl/certs", ec);
#ifndef TORRENT_DISABLE_LOGGING
		if (ec) session_log("SSL add_verify_path failed: %s", ec.message().c_str());
		ec.clear();
#endif
#endif // __APPLE__
#endif // TORRENT_USE_SSL
#ifdef TORRENT_SSL_PEERS
		m_peer_ssl_ctx.set_verify_mode(ssl::context::verify_none, ec);
		ssl::set_server_name_callback(ssl::get_handle(m_peer_ssl_ctx), ssl_server_name_callback, this, ec);
#endif // TORRENT_SSL_PEERS

#ifndef TORRENT_DISABLE_DHT
		m_next_dht_torrent = 0;
#endif
		m_next_lsd_torrent = 0;

		m_global_class = m_classes.new_peer_class("global");
		m_tcp_peer_class = m_classes.new_peer_class("tcp");
		m_local_peer_class = m_classes.new_peer_class("local");
		// local peers are always unchoked
		m_classes.at(m_local_peer_class)->ignore_unchoke_slots = true;
		// local peers are allowed to exceed the normal connection
		// limit by 50%
		m_classes.at(m_local_peer_class)->connection_limit_factor = 150;

		TORRENT_ASSERT(m_global_class == session::global_peer_class_id);
		TORRENT_ASSERT(m_tcp_peer_class == session::tcp_peer_class_id);
		TORRENT_ASSERT(m_local_peer_class == session::local_peer_class_id);

		init_peer_class_filter(true);

		// TCP, SSL/TCP and I2P connections should be assigned the TCP peer class
		m_peer_class_type_filter.add(peer_class_type_filter::tcp_socket, m_tcp_peer_class);
		m_peer_class_type_filter.add(peer_class_type_filter::ssl_tcp_socket, m_tcp_peer_class);
		m_peer_class_type_filter.add(peer_class_type_filter::i2p_socket, m_tcp_peer_class);

#ifndef TORRENT_DISABLE_LOGGING

		session_log("version: %s revision: %" PRIx64
			, lt::version_str, lt::version_revision);

#endif // TORRENT_DISABLE_LOGGING

		// ---- auto-cap max connections ----
		int const max_files = max_open_files();
		// deduct some margin for epoll/kqueue, log files,
		// futexes, shared objects etc.
		// 80% of the available file descriptors should go to connections
		m_settings.set_int(settings_pack::connections_limit, std::min(
			m_settings.get_int(settings_pack::connections_limit)
			, std::max(5, (max_files - 20) * 8 / 10)));
		// 20% goes towards regular files (see disk_io_thread)
#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("max-connections: %d max-files: %d"
				, m_settings.get_int(settings_pack::connections_limit)
				, max_files);
		}
#endif

		post(m_io_context, [this] { wrap(&session_impl::init); });
	}